

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructArgs
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t array_count)

{
  size_t array_count_00;
  BaseType BVar1;
  FieldDef *field;
  StructDef *pSVar2;
  EnumDef *pEVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  pointer ppFVar12;
  ulong uVar13;
  long lVar14;
  string local_e0;
  CSharpGenerator *local_c0;
  char *local_b8;
  size_t local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  Type local_88;
  long local_68;
  StructDef *local_60;
  StructDef *local_58;
  string local_50;
  
  ppFVar12 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar12 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = array_count - 1;
    local_c0 = this;
    local_b8 = nameprefix;
    local_b0 = array_count;
    local_58 = struct_def;
    do {
      field = *ppFVar12;
      BVar1 = (field->value).type.base_type;
      if (BVar1 == BASE_TYPE_ARRAY) {
        uVar4._0_4_ = (field->value).type.element;
        local_88.fixed_length = (field->value).type.fixed_length;
        local_88.element = BASE_TYPE_NONE;
        local_88.base_type = (BaseType)uVar4;
        pSVar2 = (field->value).type.struct_def;
        pEVar3 = (field->value).type.enum_def;
        local_88.struct_def._0_2_ = SUB82(pSVar2,0);
        local_88.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
        local_88.enum_def._0_2_ = SUB82(pEVar3,0);
        local_88.enum_def._2_6_ = (undefined6)((ulong)pEVar3 >> 0x10);
      }
      else {
        uVar4._0_4_ = (field->value).type.base_type;
        uVar4._4_4_ = (field->value).type.element;
        uVar10 = *(undefined8 *)((long)&(field->value).type.struct_def + 2);
        uVar5 = *(undefined8 *)((long)&(field->value).type.enum_def + 2);
        local_88.struct_def._0_2_ = SUB82((field->value).type.struct_def,0);
        local_88.struct_def._2_6_ = (undefined6)uVar10;
        local_88.enum_def._0_2_ = (undefined2)((ulong)uVar10 >> 0x30);
        local_88.enum_def._2_6_ = (undefined6)uVar5;
        local_88.fixed_length = (uint16_t)((ulong)uVar5 >> 0x30);
        local_88._0_8_ = uVar4;
      }
      uVar13 = (ulong)(BVar1 == BASE_TYPE_ARRAY);
      array_count_00 = uVar13 + local_b0;
      if (((BaseType)uVar4 == BASE_TYPE_STRUCT) &&
         (*(char *)(CONCAT62(local_88.struct_def._2_6_,local_88.struct_def._0_2_) + 0x110) == '\x01'
         )) {
        local_60 = (field->value).type.struct_def;
        EscapeKeyword(&local_50,local_c0,(string *)field);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        pcVar6 = local_b8;
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_98 = *plVar8;
          lStack_90 = plVar7[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar8;
          local_a8 = (long *)*plVar7;
        }
        local_a0 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        strlen(local_b8);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar6)
        ;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_e0.field_2._M_allocated_capacity = *psVar9;
          local_e0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar9;
          local_e0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_e0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        GenStructArgs(local_c0,local_60,code_ptr,local_e0._M_dataplus._M_p,array_count_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        uVar10 = local_50.field_2._M_allocated_capacity;
        _Var11._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001b1069:
          operator_delete(_Var11._M_p,uVar10 + 1);
        }
      }
      else {
        std::__cxx11::string::append((char *)code_ptr);
        GenTypeBasic_abi_cxx11_(&local_e0,local_c0,&local_88,true);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
           (field->presence == kOptional)) {
          std::__cxx11::string::append((char *)code_ptr);
        }
        if (array_count_00 != 0) {
          std::__cxx11::string::append((char *)code_ptr);
          if (array_count_00 != 1) {
            lVar14 = uVar13 + local_68;
            do {
              std::__cxx11::string::append((char *)code_ptr);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        Name_abi_cxx11_(&local_e0,local_c0,field);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0._M_dataplus._M_p);
        uVar10 = local_e0.field_2._M_allocated_capacity;
        _Var11._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_001b1069;
      }
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructArgs(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t array_count = 0) const {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto array_field = IsArray(field_type);
      const auto &type = array_field ? field_type.VectorType() : field_type;
      const auto array_cnt = array_field ? (array_count + 1) : array_count;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(*field_type.struct_def, code_ptr,
                      (nameprefix + (EscapeKeyword(field.name) + "_")).c_str(),
                      array_cnt);
      } else {
        code += ", ";
        code += GenTypeBasic(type);
        if (field.IsScalarOptional()) { code += "?"; }
        if (array_cnt > 0) {
          code += "[";
          for (size_t i = 1; i < array_cnt; i++) code += ",";
          code += "]";
        }
        code += " ";
        code += nameprefix;
        code += Name(field);
      }
    }
  }